

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O0

element<unsigned_int,_mapbox::eternal::string> *
mapbox::eternal::impl::
bound<mapbox::eternal::impl::less,mapbox::eternal::impl::element<unsigned_int,mapbox::eternal::string>const*,mapbox::eternal::impl::compare_key<unsigned_int>>
          (element<unsigned_int,_mapbox::eternal::string> *left,
          element<unsigned_int,_mapbox::eternal::string> *right,compare_key<unsigned_int> *key)

{
  bool bVar1;
  less local_31;
  ulong local_30;
  size_t step;
  size_t count;
  compare_key<unsigned_int> *key_local;
  element<unsigned_int,_mapbox::eternal::string> *right_local;
  element<unsigned_int,_mapbox::eternal::string> *left_local;
  
  step = (long)right - (long)left >> 4;
  count = (size_t)key;
  right_local = left;
  while (step != 0) {
    local_30 = step >> 1;
    key_local = (compare_key<unsigned_int> *)(right_local + local_30);
    bVar1 = less::operator()(&local_31,(element<unsigned_int,_mapbox::eternal::string> *)key_local,
                             (compare_key<unsigned_int> *)count);
    if (bVar1) {
      right_local = (element<unsigned_int,_mapbox::eternal::string> *)(key_local + 4);
      step = step - (local_30 + 1);
    }
    else {
      step = local_30;
    }
  }
  return right_local;
}

Assistant:

MAPBOX_ETERNAL_CONSTEXPR auto bound(Iterator left, Iterator right, const Key& key) noexcept {
    std::size_t count = std::size_t(right - left);
    while (count > 0) {
        const std::size_t step = count / 2;
        right = left + step;
        if (Compare()(*right, key)) {
            left = ++right;
            count -= step + 1;
        } else {
            count = step;
        }
    }
    return left;
}